

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::DryParserEM64T<wchar_t>::emit_machine
               (X86Assembler *as,ATNMachine<wchar_t> *machine,
               unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
               *machine_map,CompositeATN<wchar_t> *catn,Identifier *id,Label *rejectlabel,
               MyConstPool *pool)

{
  pointer pLVar1;
  int iVar2;
  ATNNodeType AVar3;
  int iVar4;
  reference pvVar5;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str;
  Identifier *__k;
  NFA<wchar_t> *nfa;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *this;
  size_type sVar6;
  ATNTransition<wchar_t> *pAVar7;
  uint32_t in_stack_fffffffffffffdcc;
  CodeEmitter *in_stack_fffffffffffffdd0;
  ATNPath local_158;
  ATNPath local_138;
  LookaheadDFA<wchar_t> local_118;
  int local_f4;
  undefined1 local_f0 [4];
  int j;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  undefined1 local_d0 [4];
  int outbound_num;
  ATNNode<wchar_t> *local_b0;
  ATNNode<wchar_t> *node;
  undefined1 local_a0 [4];
  int i_1;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  Label *rejectlabel_local;
  Identifier *id_local;
  CompositeATN<wchar_t> *catn_local;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  *machine_map_local;
  ATNMachine<wchar_t> *machine_local;
  X86Assembler *as_local;
  
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = rejectlabel;
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_78);
  for (local_7c = 0; iVar4 = local_7c, iVar2 = ATNMachine<wchar_t>::get_node_num(machine),
      iVar4 < iVar2; local_7c = local_7c + 1) {
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_a0);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
              ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_78,
               (value_type *)local_a0);
  }
  for (node._4_4_ = 0; iVar4 = node._4_4_, iVar2 = ATNMachine<wchar_t>::get_node_num(machine),
      iVar4 < iVar2; node._4_4_ = node._4_4_ + 1) {
    pvVar5 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                       ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_78,
                        (long)node._4_4_);
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,pvVar5);
    local_b0 = ATNMachine<wchar_t>::get_node(machine,node._4_4_);
    AVar3 = ATNNode<wchar_t>::type(local_b0);
    pLVar1 = statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    switch(AVar3) {
    case Blank:
      break;
    case Nonterminal:
      __k = ATNNode<wchar_t>::get_invoke(local_b0);
      std::
      unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
      ::operator[](machine_map,__k);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,(Operand_ *)0x17ac90);
      break;
    case LiteralTerminal:
      str = ATNNode<wchar_t>::get_literal_abi_cxx11_(local_b0);
      MatchRoutineEM64T<wchar_t>::emit(as,pool,pLVar1,str);
      break;
    case RegularTerminal:
      nfa = ATNNode<wchar_t>::get_nfa(local_b0);
      DFA<wchar_t>::DFA((DFA<wchar_t> *)local_d0,nfa,true);
      DFARoutineEM64T<wchar_t>::emit(as,pLVar1,(DFA<wchar_t> *)local_d0,pool);
      DFA<wchar_t>::~DFA((DFA<wchar_t> *)local_d0);
      break;
    case WhiteSpace:
      SkipRoutineEM64T<wchar_t>::emit(as);
    }
    this = ATNNode<wchar_t>::get_transitions(local_b0);
    sVar6 = std::
            vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
            ::size(this);
    exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar6;
    if (exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      asmjit::CodeEmitter::emit(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
    }
    else if (exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
      pAVar7 = ATNNode<wchar_t>::get_transition(local_b0,0);
      iVar4 = ATNTransition<wchar_t>::dest(pAVar7);
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_78,(long)iVar4);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,(Operand_ *)0x17adfa);
    }
    else {
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_f0);
      for (local_f4 = 0;
          pLVar1 = statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
          local_f4 <
          exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_; local_f4 = local_f4 + 1) {
        pAVar7 = ATNNode<wchar_t>::get_transition(local_b0,local_f4);
        iVar4 = ATNTransition<wchar_t>::dest(pAVar7);
        pvVar5 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                           ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_78,
                            (long)iVar4);
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
                  ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_f0,pvVar5);
      }
      in_stack_fffffffffffffdd0 = (CodeEmitter *)as;
      ATNPath::ATNPath(&local_158,id,node._4_4_);
      CompositeATN<wchar_t>::convert_atn_path(&local_138,catn,&local_158);
      LookaheadDFA<wchar_t>::LookaheadDFA(&local_118,catn,&local_138,true);
      LDFARoutineEM64T<wchar_t>::emit
                ((X86Assembler *)in_stack_fffffffffffffdd0,pLVar1,&local_118,
                 (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_f0);
      LookaheadDFA<wchar_t>::~LookaheadDFA(&local_118);
      ATNPath::~ATNPath(&local_138);
      ATNPath::~ATNPath(&local_158);
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_f0);
    }
  }
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_78);
  return;
}

Assistant:

void DryParserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const ATNMachine<TCHAR>& machine, std::unordered_map<Identifier, asmjit::Label>& machine_map, const CompositeATN<TCHAR>& catn, const Identifier& id, asmjit::Label& rejectlabel, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        as.bind(statelabels[i]);

        const ATNNode<TCHAR>& node = machine.get_node(i);

        switch (node.type())
        {
        case ATNNodeType::Blank:
            break;
        case ATNNodeType::LiteralTerminal:
            MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            break;
        case ATNNodeType::Nonterminal:
            as.call(machine_map[node.get_invoke()]);
            break;
        case ATNNodeType::RegularTerminal:
            DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            break;
        case ATNNodeType::WhiteSpace:
            SkipRoutineEM64T<TCHAR>::emit(as);
            break;
        }

        int outbound_num = node.get_transitions().size();
        if (outbound_num == 0)
        {
            as.ret();
        }
        else if (outbound_num == 1)
        {
            as.jmp(statelabels[node.get_transition(0).dest()]);
        }
        else
        {
            std::vector<asmjit::Label> exitlabels;

            for (int j = 0; j < outbound_num; j++)
            {
                exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
            }

            LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
        }
    }
}